

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::map_slot_policy<unsigned_long,unsigned_long>::
     construct<std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::piecewise_construct_t_const&,std::tuple<unsigned_long&&>,std::tuple<>>
               (allocator<std::pair<const_unsigned_long,_unsigned_long>_> *alloc,slot_type *slot,
               piecewise_construct_t *args,tuple<unsigned_long_&&> *args_1,tuple<> *args_2)

{
  tuple<> *args_local_2;
  tuple<unsigned_long_&&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_unsigned_long,_unsigned_long>_> *alloc_local;
  
  map_slot_policy<unsigned_long,_unsigned_long>::emplace(slot);
  std::allocator_traits<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>::
  construct<std::pair<unsigned_long,unsigned_long>,std::piecewise_construct_t_const&,std::tuple<unsigned_long&&>,std::tuple<>>
            (alloc,(pair<unsigned_long,_unsigned_long> *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }